

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Table *pTVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  ushort uVar13;
  long lVar14;
  Column *pCol;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  char *local_50;
  uint local_48;
  int local_44;
  sqlite3 *local_40;
  char *local_38;
  
  local_50 = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  local_44 = sqlite3Init(db,&local_50);
  local_38 = zTableName;
  if ((local_44 != 0) || (pTVar8 = sqlite3FindTable(db,zTableName,zDbName), pTVar8 == (Table *)0x0))
  {
LAB_00142bf0:
    bVar18 = false;
    pcVar9 = (char *)0x0;
    pcVar11 = (char *)0x0;
    uVar6 = 0;
    uVar15 = 0;
    uVar12 = 0;
    goto LAB_00142c0a;
  }
  if (pTVar8->eTabType == '\x02') goto LAB_00142d5a;
  if (zColumnName != (char *)0x0) {
    uVar6 = (uint)pTVar8->nCol;
    if (0 < (int)uVar6) {
      uVar16 = 0;
LAB_00142d9a:
      lVar14 = 0;
      do {
        bVar2 = pTVar8->aCol[uVar16].zCnName[lVar14];
        bVar3 = zColumnName[lVar14];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_00142dd1;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_00142dd1;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    uVar15 = 0;
    pCol = (Column *)0x0;
    goto LAB_00142e01;
  }
  pCol = (Column *)0x0;
  uVar15 = 0;
LAB_00142e4b:
  uVar12 = 0;
  if (pCol == (Column *)0x0) {
    uVar13 = 1;
    pcVar9 = "INTEGER";
    pcVar10 = (char *)0x0;
    bVar18 = false;
  }
  else {
    pcVar9 = sqlite3ColumnType(pCol,(char *)0x0);
    uVar13 = pCol->colFlags;
    pcVar10 = (char *)0x0;
    if ((uVar13 >> 9 & 1) != 0) {
      pcVar10 = pCol->zCnName + -1;
      do {
        pcVar11 = pcVar10 + 1;
        pcVar10 = pcVar10 + 1;
      } while (*pcVar11 != '\0');
      pcVar11 = pcVar10;
      if ((uVar13 & 4) != 0) {
        do {
          pcVar10 = pcVar11 + 1;
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar10;
        } while (*pcVar1 != '\0');
      }
      pcVar10 = pcVar10 + 1;
    }
    bVar18 = (pCol->field_0x8 & 0xf) != 0;
    uVar13 = uVar13 & 1;
    if (uVar15 == (int)pTVar8->iPKey) {
      uVar12 = pTVar8->tabFlags >> 3 & 1;
    }
    else {
      uVar12 = 0;
    }
  }
  uVar15 = (uint)uVar13;
  uVar6 = (uint)bVar18;
  pcVar11 = "BINARY";
  if (pcVar10 != (char *)0x0) {
    pcVar11 = pcVar10;
  }
  bVar18 = true;
LAB_00142c0a:
  if (db->noSharedCache == '\0') {
    local_48 = uVar6;
    local_40 = db;
    btreeLeaveAll(db);
    db = local_40;
    uVar6 = local_48;
  }
  if (pzDataType != (char **)0x0) {
    *pzDataType = pcVar9;
  }
  if (pzCollSeq != (char **)0x0) {
    *pzCollSeq = pcVar11;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar6;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar15;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = uVar12;
  }
  iVar7 = local_44;
  if (local_44 == 0 && !bVar18) {
    if (local_50 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_50);
    }
    local_50 = sqlite3MPrintf(db,"no such table column: %s.%s",local_38,zColumnName);
    iVar7 = 1;
  }
  pcVar11 = "%s";
  if (local_50 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  iVar5 = 0;
  sqlite3ErrorWithMsg(db,iVar7,pcVar11);
  if (local_50 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_50);
  }
  if ((iVar7 != 0) || (db->mallocFailed != '\0')) {
    iVar5 = apiHandleError(db,iVar7);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
LAB_00142dd1:
  uVar17 = uVar16;
  uVar4 = uVar16;
  if ((bVar2 == bVar3) ||
     (uVar16 = uVar16 + 1, uVar17 = (ulong)uVar6, uVar4 = (ulong)(uVar6 - 1), uVar16 == uVar6))
  goto LAB_00142de4;
  goto LAB_00142d9a;
LAB_00142de4:
  pCol = pTVar8->aCol + uVar4;
  uVar15 = (uint)uVar17;
LAB_00142e01:
  if (uVar15 == uVar6) {
    if ((pTVar8->tabFlags & 0x80) != 0) {
LAB_00142d5a:
      bVar18 = false;
      pcVar9 = (char *)0x0;
      pcVar11 = (char *)0x0;
      uVar6 = 0;
      uVar15 = 0;
      uVar12 = 0;
      goto LAB_00142c0a;
    }
    iVar7 = sqlite3IsRowid(zColumnName);
    if (iVar7 == 0) goto LAB_00142bf0;
    uVar15 = (uint)pTVar8->iPKey;
    if ((int)uVar15 < 0) {
      pCol = (Column *)0x0;
    }
    else {
      pCol = pTVar8->aCol + uVar15;
    }
  }
  goto LAB_00142e4b;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}